

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

int __thiscall ncnn::Slice::load_param(Slice *this,ParamDict *pd)

{
  int iVar1;
  Mat local_a0;
  Mat local_58;
  
  local_58.cstep = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.d = 0;
  local_58.c = 0;
  ParamDict::get(&local_a0,pd,0,&local_58);
  Mat::operator=(&this->slices,&local_a0);
  Mat::~Mat(&local_a0);
  Mat::~Mat(&local_58);
  iVar1 = ParamDict::get(pd,1,0);
  this->axis = iVar1;
  return 0;
}

Assistant:

int Slice::load_param(const ParamDict& pd)
{
    slices = pd.get(0, Mat());
    axis = pd.get(1, 0);

    return 0;
}